

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

string * __thiscall pbrt::GBufferFilm::ToString_abi_cxx11_(GBufferFilm *this)

{
  FilmBase *in_RSI;
  string *in_RDI;
  bool *args_3;
  float *in_stack_ffffffffffffffc0;
  RGBColorSpace *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  args_3 = (bool *)&stack0xffffffffffffffd0;
  FilmBase::BaseToString_abi_cxx11_(in_RSI);
  StringPrintf<std::__cxx11::string,pbrt::RGBColorSpace_const&,float_const&,bool_const&>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0,args_3);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return in_RDI;
}

Assistant:

std::string GBufferFilm::ToString() const {
    return StringPrintf("[ GBufferFilm %s colorSpace: %s maxComponentValue: %f "
                        "writeFP16: %s ]",
                        BaseToString(), *colorSpace, maxComponentValue, writeFP16);
}